

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack4to16.h
# Opt level: O0

void ncnn::convolution_im2col_sgemm_pack4to16_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,int kernel_w,int kernel_h,
               int dilation_w,int dilation_h,int stride_w,int stride_h,Option *opt)

{
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  long in_stack_00000028;
  __m128 _val;
  int j;
  int i;
  float *sptr;
  int v;
  int u;
  float *ptr;
  Mat img;
  int p;
  int gap;
  Mat bottom_im2col;
  int maxk;
  int size;
  int outh;
  int outw;
  int inch;
  int w;
  Mat *m_1;
  Mat *m;
  Option *in_stack_00001078;
  Mat *in_stack_00001080;
  Mat *in_stack_00001088;
  Mat *in_stack_00001090;
  Mat *in_stack_00001098;
  undefined8 in_stack_fffffffffffffc20;
  size_t in_stack_fffffffffffffc28;
  undefined8 in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  Mat *in_stack_fffffffffffffc40;
  int local_378;
  int local_374;
  undefined8 *local_370;
  int local_368;
  int local_364;
  Allocator *in_stack_fffffffffffffca0;
  undefined8 *local_318;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined4 local_2e8;
  long local_2e0;
  undefined4 local_2d8;
  undefined4 local_2d4;
  undefined4 local_2d0;
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined8 local_2c0;
  int local_2b8;
  int local_2b4;
  void *local_2b0;
  int *local_2a8;
  long local_2a0;
  undefined4 local_298;
  long *local_290;
  undefined4 local_288;
  int local_284;
  int local_280;
  undefined4 local_27c;
  undefined4 local_278;
  long local_270;
  int local_268;
  int local_264;
  int local_260;
  int local_25c;
  int local_258;
  int local_254;
  int local_250;
  int local_24c;
  long *local_230;
  undefined1 *local_228;
  undefined8 *local_218;
  void **local_208;
  int local_1e8;
  undefined4 local_1e4;
  void **local_1e0;
  undefined8 *local_1c0;
  undefined1 *local_1a0;
  undefined1 local_195;
  int local_194;
  void **local_190;
  undefined1 *local_188;
  undefined1 *local_168;
  int local_15c;
  undefined8 *local_158;
  undefined1 local_14d;
  int local_14c;
  undefined8 *local_140;
  void *local_f0;
  undefined8 local_e0;
  undefined4 local_d4;
  undefined8 local_d0;
  int local_c4;
  int local_c0;
  int local_bc;
  void **local_b8;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 *local_98;
  long local_90;
  undefined4 local_84;
  long local_80;
  long local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  long *local_58;
  undefined4 local_4c;
  long local_48;
  undefined8 *local_40;
  undefined4 local_34;
  int local_30;
  int local_2c;
  undefined1 *local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_254 = *(int *)((long)in_RDI + 0x2c);
  local_258 = (int)in_RDI[7];
  local_25c = *(int *)(in_RSI + 0x2c);
  local_260 = *(int *)(in_RSI + 0x30);
  local_264 = local_25c * local_260;
  local_268 = in_R8D * in_R9D;
  local_e0 = *(undefined8 *)(in_stack_00000028 + 0x10);
  local_b8 = &local_2b0;
  local_d0 = 0x10;
  local_d4 = 4;
  local_2b0 = (void *)0x0;
  local_2a8 = (int *)0x0;
  local_2a0 = 0;
  local_298 = 0;
  local_290 = (long *)0x0;
  local_288 = 0;
  local_284 = 0;
  local_280 = 0;
  local_27c = 0;
  local_278 = 0;
  local_270 = 0;
  local_250 = in_R9D;
  local_24c = in_R8D;
  local_230 = in_RDI;
  local_c4 = local_258;
  local_c0 = local_268;
  local_bc = local_264;
  Mat::create(in_stack_fffffffffffffc40,(int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
              (int)in_stack_fffffffffffffc38,(int)((ulong)in_stack_fffffffffffffc30 >> 0x20),
              in_stack_fffffffffffffc28,(int)((ulong)in_stack_fffffffffffffc20 >> 0x20),
              in_stack_fffffffffffffca0);
  local_2b4 = (local_254 * in_stack_00000020 - local_25c * in_stack_00000018) * 4;
  for (local_2b8 = 0; local_2b8 < local_258; local_2b8 = local_2b8 + 1) {
    local_140 = &local_300;
    local_64 = *(int *)((long)local_230 + 0x2c);
    local_68 = (int)local_230[6];
    local_6c = *(undefined4 *)((long)local_230 + 0x34);
    local_78 = *local_230 + local_230[8] * (long)local_2b8 * local_230[2];
    local_80 = local_230[2];
    local_84 = (undefined4)local_230[3];
    local_90 = local_230[4];
    local_60 = &local_300;
    local_8 = (long)local_64 * (long)local_68 * local_80;
    local_188 = &stack0xfffffffffffffca0;
    local_190 = &local_2b0;
    local_40 = (undefined8 *)((long)local_2b0 + local_270 * local_2b8 * local_2a0);
    local_28 = &stack0xfffffffffffffca0;
    local_18 = (long)local_284 * (long)local_280 * local_2a0;
    local_168 = &stack0xfffffffffffffca0;
    local_228 = &stack0xfffffffffffffca0;
    local_318 = local_40;
    for (local_364 = 0; local_364 < local_250; local_364 = local_364 + 1) {
      for (local_368 = 0; local_368 < local_24c; local_368 = local_368 + 1) {
        local_15c = in_stack_00000010 * local_364;
        local_158 = &local_300;
        local_370 = (undefined8 *)
                    (local_78 + (long)local_64 * (long)local_15c * local_80 +
                    (long)(in_stack_00000008 * local_368 * 4) * 4);
        for (local_374 = 0; local_374 < local_260; local_374 = local_374 + 1) {
          for (local_378 = 0; local_378 < local_25c; local_378 = local_378 + 1) {
            local_b0 = local_370;
            local_a8 = *local_370;
            uStack_a0 = local_370[1];
            local_98 = local_318;
            *local_318 = local_a8;
            local_318[1] = uStack_a0;
            local_370 = (undefined8 *)((long)local_370 + (long)(in_stack_00000018 << 2) * 4);
            local_318 = local_318 + 2;
          }
          local_370 = (undefined8 *)((long)local_370 + (long)local_2b4 * 4);
        }
      }
    }
    local_218 = &local_300;
    local_c = 0x10;
    local_1c = 0x10;
    local_2c = local_284;
    local_30 = local_280;
    local_34 = local_27c;
    local_48 = local_2a0;
    local_4c = local_298;
    local_58 = local_290;
    local_14c = local_2b8;
    local_14d = 1;
    local_194 = local_2b8;
    local_195 = 1;
    local_300 = 0;
    local_2f0 = 0;
    local_2e8 = 0;
    local_2d8 = 0;
    local_2d4 = 0;
    local_2d0 = 0;
    local_2cc = 0;
    local_2c8 = 0;
    local_2c0 = 0;
    local_2f8 = 0;
    local_1c0 = local_218;
    local_1a0 = local_228;
    local_2e0 = local_90;
  }
  im2col_sgemm_pack4to16_avx512
            (in_stack_00001098,in_stack_00001090,in_stack_00001088,in_stack_00001080,
             in_stack_00001078);
  local_208 = &local_2b0;
  if (local_2a8 != (int *)0x0) {
    local_1e4 = 0xffffffff;
    LOCK();
    local_1e8 = *local_2a8;
    *local_2a8 = *local_2a8 + -1;
    UNLOCK();
    if (local_1e8 == 1) {
      local_1e0 = local_208;
      if (local_290 == (long *)0x0) {
        local_f0 = local_2b0;
        if (local_2b0 != (void *)0x0) {
          free(local_2b0);
        }
      }
      else {
        (**(code **)(*local_290 + 0x18))(local_290,local_2b0);
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_pack4to16_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    const int size = outw * outh;

    const int maxk = kernel_w * kernel_h;

    // im2col
    Mat bottom_im2col(size, maxk, inch, 16u, 4, opt.workspace_allocator);
    {
        const int gap = (w * stride_h - outw * stride_w) * 4;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < inch; p++)
        {
            const Mat img = bottom_blob.channel(p);
            float* ptr = bottom_im2col.channel(p);

            for (int u = 0; u < kernel_h; u++)
            {
                for (int v = 0; v < kernel_w; v++)
                {
                    const float* sptr = img.row(dilation_h * u) + dilation_w * v * 4;

                    for (int i = 0; i < outh; i++)
                    {
                        int j = 0;
                        for (; j < outw; j++)
                        {
                            __m128 _val = _mm_load_ps(sptr);
                            _mm_store_ps(ptr, _val);

                            sptr += stride_w * 4;
                            ptr += 4;
                        }

                        sptr += gap;
                    }
                }
            }
        }
    }

    im2col_sgemm_pack4to16_avx512(bottom_im2col, top_blob, kernel, _bias, opt);
}